

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natwm.c
# Opt level: O1

int main(int argc,char **argv)

{
  sigset_t *__set;
  int iVar1;
  natwm_error nVar2;
  long *__ptr;
  natwm_state *state;
  map *pmVar3;
  xcb_connection_t *pxVar4;
  undefined8 uVar5;
  xcb_ewmh_connection_t *pxVar6;
  button_state *pbVar7;
  theme *ptVar8;
  char *pcVar9;
  _union_1457 _Var10;
  char *__s;
  char *__s_00;
  undefined1 local_e0 [136];
  int local_58;
  void *local_48;
  void *wm_events_result;
  pthread_t wm_events_thread;
  int screen_num;
  
  wm_events_thread._4_4_ = 0;
  __ptr = (long *)malloc(0x18);
  if (__ptr == (long *)0x0) {
    __ptr = (long *)0x0;
LAB_0010399f:
    if (__ptr != (long *)0x0) {
      initialize_logger(SUB81(__ptr[2],0));
      state = natwm_state_create();
      if (state == (natwm_state *)0x0) goto LAB_00103d91;
      state->screen_num = wm_events_thread._4_4_;
      if ((char *)*__ptr != (char *)0x0) {
        state->config_path = (char *)*__ptr;
      }
      pmVar3 = config_initialize_path(state->config_path);
      state->config = pmVar3;
      if (pmVar3 != (map *)0x0) {
        __set = (sigset_t *)(local_e0 + 8);
        local_e0._0_8_ = signal_handler;
        sigemptyset(__set);
        sigaddset(__set,0xf);
        sigaddset(__set,2);
        sigaddset(__set,1);
        local_58 = 0x10000000;
        iVar1 = sigaction(0xf,(sigaction *)local_e0,(sigaction *)0x0);
        if (((iVar1 == -1) ||
            (iVar1 = sigaction(2,(sigaction *)local_e0,(sigaction *)0x0), iVar1 == -1)) ||
           (iVar1 = sigaction(1,(sigaction *)local_e0,(sigaction *)0x0), iVar1 == -1)) {
          internal_logger(natwm_logger,LEVEL_ERROR,
                          "Failed to handle signals - This may cause problems!");
        }
        pxVar4 = (xcb_connection_t *)xcb_connect(__ptr[1],(long)&wm_events_thread + 4);
        iVar1 = xcb_connection_has_error(pxVar4);
        if (0 < iVar1) {
          if (iVar1 - 2U < 5) {
            pcVar9 = &DAT_0010c488 + *(int *)(&DAT_0010c488 + (ulong)(iVar1 - 2U) * 4);
          }
          else {
            pcVar9 = "Connection to the X server failed";
          }
          internal_logger(natwm_logger,LEVEL_CRITICAL,pcVar9);
          xcb_disconnect(pxVar4);
          pxVar4 = (xcb_connection_t *)0x0;
        }
        state->xcb = pxVar4;
        if (pxVar4 != (xcb_connection_t *)0x0) {
          internal_logger(natwm_logger,LEVEL_INFO,"Successfully connected to X server");
          iVar1 = wm_events_thread._4_4_;
          uVar5 = xcb_get_setup(state->xcb);
          local_e0._0_16_ = xcb_setup_roots_iterator(uVar5);
          _Var10.sa_handler = (__sighandler_t)0x0;
          if (local_e0._8_4_ != 0) {
            iVar1 = iVar1 + 1;
            do {
              iVar1 = iVar1 + -1;
              _Var10 = (_union_1457)local_e0._0_8_;
              if (iVar1 == 0) break;
              xcb_screen_next(local_e0);
              _Var10.sa_handler = (__sighandler_t)0x0;
            } while (local_e0._8_4_ != 0);
          }
          state->screen = (xcb_screen_t *)_Var10;
          if ((xcb_screen_t *)_Var10.sa_handler == (xcb_screen_t *)0x0) {
            pcVar9 = "Failed to find default screen";
          }
          else {
            nVar2 = event_subscribe_to_root(state);
            if (nVar2 == NO_ERROR) {
              pxVar6 = ewmh_create(state->xcb);
              state->ewmh = pxVar6;
              pcVar9 = "Failed to setup monitor";
              if (pxVar6 != (xcb_ewmh_connection_t *)0x0) {
                ewmh_init(state);
                pbVar7 = button_state_create(state->xcb);
                state->button_state = pbVar7;
                if (pbVar7 == (button_state *)0x0) {
                  pcVar9 = "Failed to initialize button state";
                }
                else {
                  nVar2 = monitor_setup(state,&state->monitor_list);
                  if (nVar2 == NO_ERROR) {
                    nVar2 = workspace_list_init(state,&state->workspace_list);
                    if (nVar2 == NO_ERROR) {
                      ptVar8 = theme_create(state->config);
                      state->workspace_list->theme = ptVar8;
                      if (state->workspace_list->theme != (theme *)0x0) {
                        status = 0;
                        local_48 = (void *)0x0;
                        iVar1 = 0;
                        pthread_create((pthread_t *)&wm_events_result,(pthread_attr_t *)0x0,
                                       wm_event_loop,state);
                        pthread_join((pthread_t)wm_events_result,&local_48);
                        if (local_48 == (void *)0x0) goto LAB_00103cb1;
                        goto LAB_00103c8e;
                      }
                      pcVar9 = "Failed to initialize client theme";
                    }
                    else {
                      pcVar9 = "Failed to setup workspaces";
                    }
                  }
                }
              }
            }
            else {
              pcVar9 = "Failed to subscribe to root events: Other window manager is present";
            }
          }
          internal_logger(natwm_logger,LEVEL_ERROR,pcVar9);
        }
      }
LAB_00103c8e:
      internal_logger(natwm_logger,LEVEL_CRITICAL,"Encountered error. Closing...");
      iVar1 = 1;
LAB_00103cb1:
      free(__ptr);
      natwm_state_destroy(state);
      destroy_logger(natwm_logger);
      return iVar1;
    }
  }
  else {
    *__ptr = 0;
    __ptr[1] = 0;
    *(undefined1 *)(__ptr + 2) = 0;
    _opterr = 0;
    while( true ) {
      while( true ) {
        while (iVar1 = getopt(argc,argv,"c:hs:vV"), iVar1 < 99) {
          if (iVar1 != 0x56) {
            if (iVar1 != -1) goto LAB_00103d84;
            goto LAB_0010399f;
          }
          *(undefined1 *)(__ptr + 2) = 1;
        }
        if (0x72 < iVar1) break;
        if (iVar1 != 99) {
          if (iVar1 != 0x68) goto LAB_00103d84;
          puts("natwm v0.0.1");
          puts("-c <file>, Set the config file");
          puts("-h,        Print this help message");
          __s = "-V,        Verbose mode";
          __s_00 = "-v,        Print version information";
          pcVar9 = "-s,        Specify specific screen for X";
          goto LAB_00103d60;
        }
        *__ptr = _optarg;
      }
      if (iVar1 != 0x73) break;
      __ptr[1] = _optarg;
    }
    if (iVar1 == 0x76) {
      __s = "Released under the Revised BSD License";
      __s_00 = "Copywrite (c) 2020 Chris Frank";
      pcVar9 = "natwm v0.0.1";
LAB_00103d60:
      puts(pcVar9);
      puts(__s_00);
      puts(__s);
      free(__ptr);
      exit(0);
    }
LAB_00103d84:
    main_cold_1();
  }
  main_cold_2();
LAB_00103d91:
  internal_logger(natwm_logger,LEVEL_CRITICAL,"Failed to initialize applicaiton state");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
        int screen_num = 0;
        struct argument_options *arg_options = parse_arguments(argc, argv);

        if (arg_options == NULL) {
                fprintf(stderr, "Failed to parse command line arguments");

                exit(EXIT_FAILURE);
        }

        // Initialize the logger
        initialize_logger(arg_options->verbose);

        // Initialize program state
        struct natwm_state *state = natwm_state_create();

        if (state == NULL) {
                LOG_CRITICAL(natwm_logger, "Failed to initialize applicaiton state");

                exit(EXIT_FAILURE);
        }

        state->screen_num = screen_num;

        // Initialize config
        if (arg_options->config_path) {
                state->config_path = arg_options->config_path;
        }

        state->config = config_initialize_path(state->config_path);

        if (state->config == NULL) {
                goto free_and_error;
        }

        // Catch and handle signals
        if (install_signal_handlers() != 0) {
                LOG_ERROR(natwm_logger, "Failed to handle signals - This may cause problems!");
        }

        // Initialize x
        state->xcb = make_connection(arg_options->screen, &screen_num);

        if (state->xcb == NULL) {
                goto free_and_error;
        }

        LOG_INFO(natwm_logger, "Successfully connected to X server");

        // Find the default screen
        state->screen = find_default_screen(state->xcb, screen_num);

        if (state->screen == NULL) {
                LOG_ERROR(natwm_logger, "Failed to find default screen");

                goto free_and_error;
        }

        // Attempt to register for substructure events
        if (event_subscribe_to_root(state) != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to subscribe to root events: Other window "
                          "manager is present");

                goto free_and_error;
        }

        state->ewmh = ewmh_create(state->xcb);

        if (state->ewmh == NULL) {
                LOG_ERROR(natwm_logger, "Failed to setup monitor");

                goto free_and_error;
        }

        // Initialize ewmh hinting
        ewmh_init(state);

        state->button_state = button_state_create(state->xcb);

        if (state->button_state == NULL) {
                LOG_ERROR(natwm_logger, "Failed to initialize button state");

                goto free_and_error;
        }

        if (monitor_setup(state, &state->monitor_list) != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to setup monitor");

                goto free_and_error;
        }

        if (workspace_list_init(state, &state->workspace_list) != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to setup workspaces");

                goto free_and_error;
        }

        // Before we can start registering clients we need to load the theme
        // from the configuration file. This will save us trips to the config
        // map when registering clients.
        //
        // TODO: Set defaults so we don't have a hard requirement on the user
        // settings these in their configuration
        state->workspace_list->theme = theme_create(state->config);

        if (state->workspace_list->theme == NULL) {
                LOG_ERROR(natwm_logger, "Failed to initialize client theme");

                goto free_and_error;
        }

        status = RUNNING;

        // Start wm thread
        void *wm_events_result = NULL;
        pthread_t wm_events_thread;

        pthread_create(&wm_events_thread, NULL, wm_event_loop, state);
        pthread_join(wm_events_thread, &wm_events_result);

        if ((intptr_t)wm_events_result != 0) {
                goto free_and_error;
        }

        free(arg_options);
        natwm_state_destroy(state);
        destroy_logger(natwm_logger);

        return EXIT_SUCCESS;

free_and_error:
        LOG_CRITICAL(natwm_logger, "Encountered error. Closing...");

        free(arg_options);
        natwm_state_destroy(state);
        destroy_logger(natwm_logger);

        return EXIT_FAILURE;
}